

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

Simplex_handle __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
find<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *s)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  allocator<int> local_59;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_58;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> copy;
  const_iterator last;
  const_iterator first;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *s_local;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this_local;
  
  last = std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>(in_RDX);
  copy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>(in_RDX);
  bVar1 = __gnu_cxx::operator==
                    (&last,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&copy.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    null_simplex();
  }
  else {
    local_50._M_current = last._M_current;
    local_58._M_current =
         (unsigned_long *)
         copy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    std::allocator<int>::allocator(&local_59);
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<int,std::allocator<int>> *)local_48,local_50,local_58,&local_59);
    std::allocator<int>::~allocator(&local_59);
    __first = std::begin<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)local_48);
    __last = std::end<std::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)local_48);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
    find_simplex(this,(vector<int,_std::allocator<int>_> *)s);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  }
  return (Simplex_handle)
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)this;
}

Assistant:

Simplex_handle find(const InputVertexRange & s) const {
    auto first = std::begin(s);
    auto last = std::end(s);

    if (first == last)
      return null_simplex();  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return find_simplex(copy);
  }